

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *this,unsigned_long *key)

{
  Type piVar1;
  uint uVar2;
  Type this_00;
  uint uVar3;
  
  piVar1 = this->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = GetBucket(((uint)(*key >> 0x20) ^ (uint)*key) * 2 + 1,this->bucketCount,
                      this->modFunctionIndex);
    uVar3 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<unsigned_long,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_unsigned_long>.
            super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_unsigned_long>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_unsigned_long>.key == *key) {
          this_00 = this->stats;
          goto LAB_008fd6e0;
        }
        uVar2 = uVar2 + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<unsigned_long,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_long,_unsigned_long>.
                super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_unsigned_long>_>
                .super_KeyValueEntryDataLayout2<unsigned_long,_unsigned_long>.next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_008fd6e0:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }